

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O2

bool __thiscall
slang::ast::SystemSubroutine::checkArgCount
          (SystemSubroutine *this,ASTContext *context,bool isMethod,Args *args,SourceRange callRange
          ,size_t min,size_t max)

{
  pointer ppEVar1;
  size_t sVar2;
  bool bVar3;
  Diagnostic *pDVar4;
  long lVar5;
  DiagCode code;
  SourceLocation SVar6;
  SourceLocation SVar7;
  Args *__range2;
  ulong arg;
  SourceRange sourceRange;
  
  SVar7 = callRange.endLoc;
  SVar6 = callRange.startLoc;
  ppEVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  lVar5 = 0;
  do {
    if (sVar2 << 3 == lVar5) {
      arg = (args->_M_extent)._M_extent_value - (ulong)isMethod;
      if (arg < min) {
        code.subsystem = Expressions;
        code.code = 0x9f;
      }
      else {
        if (arg <= max) {
          return true;
        }
        SVar6 = (args->_M_ptr[max]->sourceRange).startLoc;
        SVar7 = (args->_M_ptr[max]->sourceRange).endLoc;
        code.subsystem = Expressions;
        code.code = 0xa0;
        min = max;
      }
      sourceRange.endLoc = SVar7;
      sourceRange.startLoc = SVar6;
      pDVar4 = ASTContext::addDiag(context,code,sourceRange);
      pDVar4 = Diagnostic::operator<<(pDVar4,&this->name);
      pDVar4 = Diagnostic::operator<<<unsigned_long>(pDVar4,min);
      Diagnostic::operator<<<unsigned_long>(pDVar4,arg);
      return false;
    }
    bVar3 = Expression::bad(*(Expression **)((long)ppEVar1 + lVar5));
    lVar5 = lVar5 + 8;
  } while (!bVar3);
  return false;
}

Assistant:

bool SystemSubroutine::checkArgCount(const ASTContext& context, bool isMethod, const Args& args,
                                     SourceRange callRange, size_t min, size_t max) const {
    for (auto arg : args) {
        if (arg->bad())
            return false;
    }

    size_t provided = args.size();
    if (isMethod) {
        SLANG_ASSERT(provided);
        provided--;
    }

    if (provided < min) {
        context.addDiag(diag::TooFewArguments, callRange) << name << min << provided;
        return false;
    }

    if (provided > max) {
        context.addDiag(diag::TooManyArguments, args[max]->sourceRange) << name << max << provided;
        return false;
    }

    return true;
}